

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

void nghttp2_bufs_reset(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *pnVar1;
  nghttp2_mem *mem;
  size_t sVar2;
  nghttp2_bufs *pnVar3;
  size_t sVar4;
  uint8_t *puVar5;
  nghttp2_buf_chain *ptr;
  
  sVar2 = bufs->chunk_keep;
  pnVar3 = bufs;
  sVar4 = sVar2;
  do {
    pnVar3 = (nghttp2_bufs *)pnVar3->head;
    if (pnVar3 == (nghttp2_bufs *)0x0) goto LAB_006269c5;
    puVar5 = ((nghttp2_buf *)&pnVar3->cur)->begin;
    pnVar3->chunk_used = (size_t)puVar5;
    puVar5 = puVar5 + bufs->offset;
    pnVar3->chunk_length = (size_t)puVar5;
    pnVar3->max_chunk = (size_t)puVar5;
    sVar4 = sVar4 - 1;
  } while (sVar4 != 0);
  ptr = pnVar3->head;
  pnVar3->head = (nghttp2_buf_chain *)0x0;
  if (ptr != (nghttp2_buf_chain *)0x0) {
    do {
      pnVar1 = ptr->next;
      mem = bufs->mem;
      nghttp2_mem_free(mem,(ptr->buf).begin);
      (ptr->buf).begin = (uint8_t *)0x0;
      nghttp2_mem_free(mem,ptr);
      ptr = pnVar1;
    } while (pnVar1 != (nghttp2_buf_chain *)0x0);
    sVar2 = bufs->chunk_keep;
  }
  bufs->chunk_used = sVar2;
LAB_006269c5:
  bufs->cur = bufs->head;
  return;
}

Assistant:

void nghttp2_bufs_reset(nghttp2_bufs *bufs) {
  nghttp2_buf_chain *chain, *ci;
  size_t k;

  k = bufs->chunk_keep;

  for (ci = bufs->head; ci; ci = ci->next) {
    nghttp2_buf_reset(&ci->buf);
    nghttp2_buf_shift_right(&ci->buf, bufs->offset);

    if (--k == 0) {
      break;
    }
  }

  if (ci) {
    chain = ci->next;
    ci->next = NULL;

    for (ci = chain; ci;) {
      chain = ci->next;

      buf_chain_del(ci, bufs->mem);

      ci = chain;
    }

    bufs->chunk_used = bufs->chunk_keep;
  }

  bufs->cur = bufs->head;
}